

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O2

void eltcalc::doeltoutput
               (int samplesize,bool skipHeader,bool ordOutput,FILE **fout,
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *parquetFileNames)

{
  bool bVar1;
  size_t sVar2;
  pointer pfVar3;
  undefined7 in_register_00000011;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_ac;
  float local_a8;
  OASIS_FLOAT local_a4;
  int local_9c;
  OASIS_FLOAT local_98;
  summarySampleslevelHeader sh;
  FILE *local_88;
  code *local_80;
  sampleslevelRec sr;
  vector<float,_std::allocator<float>_> losses_vec;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  if ((int)CONCAT71(in_register_00000011,ordOutput) == 0) {
    if ((parquetFileNames->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      bVar1 = true;
      local_80 = (code *)0x0;
      local_88 = (FILE *)0x0;
      goto LAB_00102a8c;
    }
    if (!skipHeader) {
      puts("summary_id,type,event_id,mean,standard_deviation,exposure_value");
    }
    local_88 = _stdout;
    local_80 = OutputRows;
  }
  else {
    if (!skipHeader) {
      if ((FILE *)*fout != (FILE *)0x0) {
        fwrite("EventId,SummaryId,SampleType,EventRate,ChanceOfLoss,MeanLoss,SDLoss,MaxLoss,FootprintExposure,MeanImpactedExposure,MaxImpactedExposure\n"
               ,0x87,1,(FILE *)*fout);
      }
      if ((FILE *)fout[1] != (FILE *)0x0) {
        fwrite("EventId,SummaryId,Quantile,Loss\n",0x20,1,(FILE *)fout[1]);
      }
    }
    local_88 = *fout;
    local_80 = OutputRowsORD;
  }
  bVar1 = false;
LAB_00102a8c:
  losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (fout[1] != (FILE *)0x0) {
    sh.event_id = 0;
    std::vector<float,_std::allocator<float>_>::resize
              (&losses_vec,(long)samplesize,(value_type_conflict *)&sh);
  }
  sVar2 = fread(&sh,0xc,1,_stdin);
  fVar4 = (float)samplesize;
  local_bc = 0.0;
  while (sVar2 != 0) {
    local_9c = 0;
    fVar5 = 0.0;
    local_b8 = 0.0;
    local_a8 = 0.0;
    local_a4 = 0.0;
    local_98 = 0.0;
    local_b4 = 0.0;
    while ((sVar2 = fread(&sr,8,1,_stdin), sVar2 != 0 && (sr.sidx != 0))) {
      if (sr.sidx < 1) {
        if ((ulong)(uint)sr.sidx == 0xfffffffb) {
          local_a4 = sr.loss;
        }
        else if (sr.sidx == -1) {
          local_98 = sr.loss;
        }
      }
      else {
        if (fout[1] != (FILE *)0x0) {
          losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[(ulong)(uint)sr.sidx - 1] = sr.loss;
        }
        local_b4 = local_b4 + sr.loss;
        fVar5 = sr.loss * sr.loss + fVar5;
        if (0.0 < sr.loss) {
          local_b8 = local_b8 + sh.expval;
          fVar6 = sh.expval;
          if (sh.expval <= local_a8) {
            fVar6 = local_a8;
          }
          local_9c = local_9c + 1;
          local_a8 = fVar6;
        }
      }
    }
    if (samplesize < 2) {
      local_c0 = 0.0;
      fVar5 = 0.0;
      if (samplesize != 0) {
        fVar5 = local_bc;
      }
      if (samplesize == 1) {
        fVar5 = local_b4;
      }
      local_ac = 0.0;
      local_bc = fVar5;
    }
    else {
      fVar6 = (fVar5 - (local_b4 * local_b4) / fVar4) / (float)(samplesize + -1);
      local_ac = 0.0;
      if (1e-07 <= fVar6 / fVar5) {
        local_ac = fVar6;
      }
      if (local_ac < 0.0) {
        local_ac = sqrtf(local_ac);
      }
      else {
        local_ac = SQRT(local_ac);
      }
      local_b8 = local_b8 / fVar4;
      local_c0 = (float)local_9c / fVar4;
      local_bc = local_b4 / fVar4;
    }
    if (0.0 < sh.expval) {
      if (!bVar1) {
        (*local_80)(local_98,0,sh.expval,sh.expval,0,local_a4,&sh,1,local_88);
      }
      if (firstOutput == '\x01') {
        local_38.__r = 1000;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
        firstOutput = '\0';
      }
      if (samplesize != 0) {
        if (!bVar1) {
          (*local_80)(local_bc,local_ac,local_b8,local_a8,local_c0,local_a4,&sh,2,local_88);
        }
        if (fout[1] != (FILE *)0x0) {
          std::
          __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          OutputQuantiles(&sh,&losses_vec,fout[1]);
          for (pfVar3 = losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pfVar3 != losses_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish; pfVar3 = pfVar3 + 1) {
            *pfVar3 = 0.0;
          }
        }
      }
    }
    if (sVar2 == 0) {
      sVar2 = 0;
    }
    else {
      sVar2 = fread(&sh,0xc,1,_stdin);
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&losses_vec.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void doeltoutput(int samplesize, bool skipHeader, bool ordOutput,
			 FILE **fout,
			 std::map<int, std::string> &parquetFileNames)
	{
		OASIS_FLOAT sumloss = 0.0;
		OASIS_FLOAT sample_mean = 0.0;
		OASIS_FLOAT analytical_mean = 0.0;
		OASIS_FLOAT sd = 0;
		OASIS_FLOAT sumlosssqr = 0.0;
		void (*OutputData)(const summarySampleslevelHeader&, const int,
				   const OASIS_FLOAT, const OASIS_FLOAT, FILE*,
				   const OASIS_FLOAT, const OASIS_FLOAT,
				   const OASIS_FLOAT, const OASIS_FLOAT);
		OutputData = nullptr;
		FILE * outFile = nullptr;
		if (ordOutput) {
			if (skipHeader == false) {
				if (fout[MELT] != nullptr) {
					fprintf(fout[MELT],
						"EventId,SummaryId,SampleType,"
						"EventRate,ChanceOfLoss,"
						"MeanLoss,SDLoss,MaxLoss,"
						"FootprintExposure,"
						"MeanImpactedExposure,"
						"MaxImpactedExposure\n");
				}
				if (fout[QELT] != nullptr) {
					fprintf(fout[QELT], "EventId,SummaryId,Quantile,Loss\n");
				}
			}
			OutputData = &eltcalc::OutputRowsORD;
			outFile = fout[MELT];
		} else if (parquetFileNames.size() == 0) {
			if (skipHeader == false) {
				printf("summary_id,type,event_id,mean,standard_deviation,exposure_value\n");
			}
			OutputData = &eltcalc::OutputRows;
			outFile = stdout;
		}

#ifdef HAVE_PARQUET
		std::map<int, parquet::StreamWriter> os;
		for (auto iter = parquetFileNames.begin();
		  iter != parquetFileNames.end(); ++iter)  {
			os[iter->first] = OasisParquet::GetParquetStreamWriter(iter->first, iter->second);
		}
#endif

		// Losses for calculating quantiles
		std::vector<OASIS_FLOAT> losses_vec;
#ifdef HAVE_PARQUET
		if (fout[QELT] != nullptr || parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end())
#else
		if (fout[QELT] != nullptr)
#endif
		{
			losses_vec.resize(samplesize, 0);
		}

		summarySampleslevelHeader sh;
		size_t i = fread(&sh, sizeof(sh), 1, stdin);
		while (i != 0) {
			OASIS_FLOAT mean_impacted_exposure = 0;
			OASIS_FLOAT max_impacted_exposure = 0;
			OASIS_FLOAT chance_of_loss = 0;
			int non_zero_samples = 0;
			OASIS_FLOAT max_loss = 0;
			sampleslevelRec sr;
			i = fread(&sr, sizeof(sr), 1, stdin);
			while (i != 0 && sr.sidx != 0) {
				if (sr.sidx > 0) {
					sumloss += sr.loss;
					sumlosssqr += (sr.loss * sr.loss);
#ifdef HAVE_PARQUET
					if (fout[QELT] != nullptr || parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end())
#else
					if (fout[QELT] != nullptr)
#endif
					{
						losses_vec[sr.sidx-1] = sr.loss;
					}
					if (sr.loss > 0) {
						mean_impacted_exposure += sh.expval;
						if (sh.expval > max_impacted_exposure) {
							max_impacted_exposure = sh.expval;
						}
						non_zero_samples++;
					}
				} else if (sr.sidx == -1) {
					analytical_mean = sr.loss;
				} else if (sr.sidx == max_loss_idx) {
					max_loss = sr.loss;
				}
				i = fread(&sr, sizeof(sr), 1, stdin);
			}
			if (samplesize > 1) {
				sample_mean = sumloss / samplesize;
				sd = (sumlosssqr - ((sumloss*sumloss) / samplesize)) / (samplesize - 1);
				OASIS_FLOAT x = sd / sumlosssqr;
				if (x < 0.0000001) sd = 0;   // fix OASIS_FLOATing point precision problems caused by using large numbers
				sd = sqrt(sd);
				mean_impacted_exposure /= samplesize;
				chance_of_loss = non_zero_samples / (OASIS_FLOAT)samplesize;   // relative frequency
			}
			else {
				if (samplesize == 0) {
					sd = 0;
					sample_mean = 0;
				}
				if (samplesize == 1) {
					sample_mean = sumloss / samplesize;
					sd = 0;
				}
			}
			if (sh.expval > 0) {   // only output rows with a non-zero exposure value
				if (OutputData != nullptr) {
					OutputData(sh, 1, analytical_mean, 0,
						   outFile, sh.expval,
						   sh.expval, 0.0, max_loss);
				}
#ifdef HAVE_PARQUET
				if (parquetFileNames.find(OasisParquet::MELT) != parquetFileNames.end()) {
					OutputRowsParquet(sh, 1,
							  analytical_mean, 0,
							  os[OasisParquet::MELT],
							  sh.expval, sh.expval,
							  0.0, max_loss);
				}
#endif
				if (firstOutput == true) {
					std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY)); // used to stop possible race condition with kat
					firstOutput = false;
				}
				if (samplesize) {
					if (OutputData != nullptr) {
						OutputData(sh, 2, sample_mean,
							   sd, outFile,
							   mean_impacted_exposure,
							   max_impacted_exposure,
							   chance_of_loss,
							   max_loss);
					}
#ifdef HAVE_PARQUET
					if (parquetFileNames.find(OasisParquet::MELT) != parquetFileNames.end()) {
						OutputRowsParquet(sh, 2,
								  sample_mean,
								  sd,
								  os[OasisParquet::MELT],
								  mean_impacted_exposure,
								  max_impacted_exposure,
								  chance_of_loss,
								  max_loss);
					}
					if (fout[QELT] != nullptr || parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end())
#else
					if (fout[QELT] != nullptr)
#endif
					{
						std::sort(losses_vec.begin(), losses_vec.end());
#ifdef HAVE_PARQUET
						OutputQuantiles(sh, losses_vec, fout[QELT], os);
#else
						OutputQuantiles(sh, losses_vec, fout[QELT]);
#endif
						std::fill(losses_vec.begin(), losses_vec.end(), 0);
					}
				}
			}


			if (i) i = fread(&sh, sizeof(sh), 1, stdin);

			sumloss = 0.0;
			sumlosssqr = 0.0;
			sd = 0.0;
			analytical_mean = 0.0;
		}

	}
	void doit(bool skipHeader, bool ordOutput, FILE **fout,
		  std::map<int, std::string> &parquetFileNames)
	{
		unsigned int stream_type = 0;
		size_t i = fread(&stream_type, sizeof(stream_type), 1, stdin);

#ifdef HAVE_PARQUET
		if ((ordOutput && fout[MELT] != nullptr) ||
		    parquetFileNames.find(OasisParquet::MELT) != parquetFileNames.end()) {
			GetEventRates();
		}
#else
		if (ordOutput && fout[MELT] != nullptr) GetEventRates();
#endif

		if (isSummaryCalcStream(stream_type) == true) {
			unsigned int samplesize;
			unsigned int summaryset_id;
			i = fread(&samplesize, sizeof(samplesize), 1, stdin);

#ifdef HAVE_PARQUET
			if ((ordOutput && fout[QELT] != nullptr) ||
			    parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end()) {
				GetIntervals(samplesize);
			}
#else
			if (ordOutput && fout[QELT] != nullptr) GetIntervals(samplesize);
#endif

			if (i == 1) i = fread(&summaryset_id,
					      sizeof(summaryset_id), 1, stdin);
			if (i == 1) {
				doeltoutput(samplesize, skipHeader, ordOutput,
					    fout, parquetFileNames);
			}
			else {
				fprintf(stderr, "FATAL: Stream read error\n");
			}
			return;
		}

		fprintf(stderr, "FATAL: %s: Not a gul stream\n", __func__);
		fprintf(stderr, "FATAL: %s: invalid stream type %d\n", __func__, stream_type);
		exit(-1);
	}


	void touch(const std::string &filepath)
	{
		FILE *fout = fopen(filepath.c_str(), "wb");
		fclose(fout);
	}
	void setinitdone(int processid)
	{
		if (processid) {
			std::ostringstream s;
			s << SEMA_DIR_PREFIX << "_elt/" << processid << ".id";
			touch(s.str());
		}
	}
}